

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

CallFrame * new_call_frame(void)

{
  CallFrame *pCVar1;
  
  pCVar1 = (CallFrame *)malloc(0x50);
  pCVar1->ip = (uint8_t *)0x0;
  (pCVar1->code_buffer).cap = 0;
  (pCVar1->code_buffer).count = 0;
  (pCVar1->code_buffer).code = (uint8_t *)0x0;
  (pCVar1->variables).cap = 0;
  (pCVar1->variables).count = 0;
  (pCVar1->variables).values = (CrispyValue *)0x0;
  (pCVar1->constants).cap = 0;
  (pCVar1->constants).count = 0;
  (pCVar1->constants).values = (CrispyValue *)0x0;
  return pCVar1;
}

Assistant:

CallFrame *new_call_frame() {
    CallFrame *call_frame = malloc(sizeof(CallFrame));
    call_frame->ip = NULL;

    CodeBuffer code_buffer;
    code_buff_init(&code_buffer);
    call_frame->code_buffer = code_buffer;

    ValueArray variables;
    val_arr_init(&variables);
    call_frame->variables = variables;

    ValueArray constants;
    val_arr_init(&constants);
    call_frame->constants = constants;

    return call_frame;
}